

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  size_t sVar1;
  byte extraout_AL;
  byte bVar2;
  int iVar3;
  type_info *ptVar4;
  PyObject *pPVar5;
  pointer __s;
  internals *this_00;
  mapped_type *pmVar6;
  mapped_type *ppvVar7;
  vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>> *pvVar8;
  ulong uVar9;
  long lVar10;
  object *poVar11;
  long *plVar12;
  key_type *pkVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  type_index tindex;
  allocator local_89;
  undefined1 local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (((rec->scope).m_ptr != (PyObject *)0x0) && (iVar3 = PyObject_HasAttrString(), iVar3 == 1)) {
    std::__cxx11::string::string((string *)&local_68,rec->name,&local_89);
    std::operator+(&local_48,"generic_type: cannot initialize type \"",&local_68);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_88._0_8_ = *plVar12;
    pkVar13 = (key_type *)(plVar12 + 2);
    if ((key_type *)local_88._0_8_ == pkVar13) {
      local_88._16_8_ = *pkVar13;
      local_88._24_8_ = plVar12[3];
      local_88._0_8_ = local_88 + 0x10;
    }
    else {
      local_88._16_8_ = *pkVar13;
    }
    local_88._8_8_ = plVar12[1];
    *plVar12 = (long)pkVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pybind11_fail((string *)local_88);
  }
  ptVar4 = get_type_info(rec->type,false);
  if (ptVar4 != (type_info *)0x0) {
    std::__cxx11::string::string((string *)&local_68,rec->name,&local_89);
    std::operator+(&local_48,"generic_type: type \"",&local_68);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_88._0_8_ = *plVar12;
    pkVar13 = (key_type *)(plVar12 + 2);
    if ((key_type *)local_88._0_8_ == pkVar13) {
      local_88._16_8_ = *pkVar13;
      local_88._24_8_ = plVar12[3];
      local_88._0_8_ = local_88 + 0x10;
    }
    else {
      local_88._16_8_ = *pkVar13;
    }
    local_88._8_8_ = plVar12[1];
    *plVar12 = (long)pkVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pybind11_fail((string *)local_88);
  }
  pPVar5 = make_new_python_type(rec);
  (this->super_object).super_handle.m_ptr = pPVar5;
  __s = (pointer)operator_new(0x88);
  memset(__s,0,0x88);
  *(PyObject **)__s = pPVar5;
  *(type_info **)(__s + 8) = rec->type;
  *(size_t *)(__s + 0x10) = rec->type_size;
  *(_func_void_ptr_size_t **)(__s + 0x20) = rec->operator_new;
  sVar1 = rec->holder_size;
  log2((detail *)0x8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  *(size_t *)(__s + 0x18) = (sVar1 - 1 >> (extraout_AL & 0x3f)) + 1;
  *(_func_void_instance_ptr_void_ptr **)(__s + 0x28) = rec->init_holder;
  *(_func_void_value_and_holder_ptr **)(__s + 0x30) = rec->dealloc;
  __s[0x80] = __s[0x80] | 3;
  this_00 = get_internals();
  local_48._M_dataplus._M_p = (pointer)rec->type;
  pmVar6 = std::__detail::
           _Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this_00->direct_conversions,(key_type *)&local_48);
  *(mapped_type **)(__s + 0x68) = pmVar6;
  __s[0x80] = __s[0x80] & 0xfbU | (byte)rec->field_0x58 >> 1 & 4;
  ppvVar7 = std::__detail::
            _Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_48);
  *ppvVar7 = __s;
  local_68._M_dataplus._M_p = (pointer)(this->super_object).super_handle.m_ptr;
  local_88._0_8_ = __s;
  pvVar8 = (vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>> *)
           std::__detail::
           _Map_base<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this_00->registered_types_py,(key_type *)&local_68);
  std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>::
  _M_assign_aux<pybind11::detail::type_info*const*>(pvVar8,local_88,local_88 + 8);
  uVar9 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
  if ((uVar9 < 2) && ((rec->field_0x58 & 1) == 0)) {
    lVar10 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
    if (lVar10 != 1) {
      return;
    }
    local_88._8_8_ = (rec->bases).super_object.super_handle.m_ptr;
    local_88._16_8_ = 0;
    local_88._24_8_ = (PyObject *)0x0;
    poVar11 = accessor<pybind11::detail::accessor_policies::list_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::list_item> *)local_88);
    ptVar4 = get_type_info((PyTypeObject *)(poVar11->super_handle).m_ptr);
    object::~object((object *)(local_88 + 0x18));
    bVar2 = __s[0x80] & 0xfdU | ptVar4->field_0x80 & 2;
  }
  else {
    mark_parents_nonsimple(this,*(PyTypeObject **)__s);
    bVar2 = __s[0x80] & 0xfd;
  }
  __s[0x80] = bVar2;
  return;
}

Assistant:

void initialize(const type_record &rec) {
        if (rec.scope && hasattr(rec.scope, rec.name))
            pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec.name) +
                          "\": an object with that name is already defined");

        if (get_type_info(*rec.type))
            pybind11_fail("generic_type: type \"" + std::string(rec.name) +
                          "\" is already registered!");

        m_ptr = make_new_python_type(rec);

        /* Register supplemental type information in C++ dict */
        auto *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) m_ptr;
        tinfo->cpptype = rec.type;
        tinfo->type_size = rec.type_size;
        tinfo->operator_new = rec.operator_new;
        tinfo->holder_size_in_ptrs = size_in_ptrs(rec.holder_size);
        tinfo->init_holder = rec.init_holder;
        tinfo->dealloc = rec.dealloc;
        tinfo->simple_type = true;
        tinfo->simple_ancestors = true;

        auto &internals = get_internals();
        auto tindex = std::type_index(*rec.type);
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        tinfo->default_holder = rec.default_holder;
        internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[(PyTypeObject *) m_ptr] = { tinfo };

        if (rec.bases.size() > 1 || rec.multiple_inheritance) {
            mark_parents_nonsimple(tinfo->type);
            tinfo->simple_ancestors = false;
        }
        else if (rec.bases.size() == 1) {
            auto parent_tinfo = get_type_info((PyTypeObject *) rec.bases[0].ptr());
            tinfo->simple_ancestors = parent_tinfo->simple_ancestors;
        }
    }